

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cpp
# Opt level: O2

void iDynTree::addLinkToTraversal
               (Model *model,Traversal *traversal,LinkIndex linkToAdd,JointIndex parentJointToAdd,
               LinkIndex parentLinkToAdd,
               deque<iDynTree::stackEl,_std::allocator<iDynTree::stackEl>_> *linkToVisit)

{
  pointer pLVar1;
  stackEl el;
  value_type local_30;
  
  pLVar1 = (model->links).super__Vector_base<iDynTree::Link,_std::allocator<iDynTree::Link>_>.
           _M_impl.super__Vector_impl_data._M_start;
  Traversal::addTraversalElement
            (traversal,pLVar1 + linkToAdd,
             (model->joints).
             super__Vector_base<iDynTree::IJoint_*,_std::allocator<iDynTree::IJoint_*>_>._M_impl.
             super__Vector_impl_data._M_start[parentJointToAdd],pLVar1 + parentLinkToAdd);
  local_30.parent =
       (model->links).super__Vector_base<iDynTree::Link,_std::allocator<iDynTree::Link>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_30.link = local_30.parent + linkToAdd;
  local_30.parent = local_30.parent + parentLinkToAdd;
  std::deque<iDynTree::stackEl,_std::allocator<iDynTree::stackEl>_>::push_back
            (linkToVisit,&local_30);
  return;
}

Assistant:

void addLinkToTraversal(const Model & model, Traversal & traversal,
                        LinkIndex linkToAdd, JointIndex parentJointToAdd, LinkIndex parentLinkToAdd,
                        std::deque<stackEl> & linkToVisit)
{
    traversal.addTraversalElement(model.getLink(linkToAdd),
                                  model.getJoint(parentJointToAdd),
                                  model.getLink(parentLinkToAdd));

    stackEl el;
    el.link = model.getLink(linkToAdd);
    el.parent = model.getLink(parentLinkToAdd);

    linkToVisit.push_back(el);
}